

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::writeFile
          (QMakeEvaluator *this,QString *ctx,QString *fn,OpenMode mode,VfsFlags flags,
          QString *contents)

{
  bool bVar1;
  int id;
  int id_00;
  storage_type *psVar2;
  VisitReturn VVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  id = QMakeVfs::idForFileName
                 (this->m_vfs,fn,
                  (VfsFlags)
                  ((uint)flags.super_QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>.
                         super_QFlagsStorage<QMakeVfs::VfsFlag>.i | 0x10));
  id_00 = QMakeVfs::idForFileName(this->m_vfs,fn,flags);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  bVar1 = QMakeVfs::writeFile(this->m_vfs,id_00,mode,flags,contents,(QString *)&local_58);
  if (bVar1) {
    VVar3 = ReturnTrue;
    if (id != 0) {
      QMakeParser::discardFileFromCache(this->m_parser,id);
    }
  }
  else {
    psVar2 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("Cannot write %1file %2: %3",0x1b);
    QVar4.m_data = psVar2;
    QVar4.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar4);
    QDir::toNativeSeparators((QString *)&local_a0);
    QString::arg<QString_const&,QString,QString&>
              ((type *)&local_70,(QString *)&local_88,ctx,(QString *)&local_a0,(QString *)&local_58)
    ;
    evalError(this,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    VVar3 = ReturnFalse;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn
QMakeEvaluator::writeFile(const QString &ctx, const QString &fn, QIODevice::OpenMode mode,
                          QMakeVfs::VfsFlags flags, const QString &contents)
{
    int oldId = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsAccessedOnly);
    int id = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsCreate);
    QString errStr;
    if (!m_vfs->writeFile(id, mode, flags, contents, &errStr)) {
        evalError(fL1S("Cannot write %1file %2: %3")
                  .arg(ctx, QDir::toNativeSeparators(fn), errStr));
        return ReturnFalse;
    }
    if (oldId)
        m_parser->discardFileFromCache(oldId);
    return ReturnTrue;
}